

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O3

uint64_t BinarySource_get_uint64(BinarySource *src)

{
  size_t sVar1;
  ulong uVar2;
  
  if (src->err == BSE_NO_ERROR) {
    sVar1 = src->pos;
    if (7 < src->len - sVar1) {
      src->pos = sVar1 + 8;
      uVar2 = *(ulong *)((long)src->data + sVar1);
      return uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
             (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
             (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    }
    src->err = BSE_OUT_OF_DATA;
  }
  return 0;
}

Assistant:

static bool BinarySource_data_avail(BinarySource *src, size_t wanted)
{
    if (src->err)
        return false;

    if (wanted <= src->len - src->pos)
        return true;

    src->err = BSE_OUT_OF_DATA;
    return false;
}